

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

char * zt_cstr_dup(char *s,ssize_t i,ssize_t j,ssize_t n)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  if (s == (char *)0x0) {
    return (char *)0x0;
  }
  sVar2 = strlen(s);
  if (sVar2 == 0) {
    lVar8 = 0;
    lVar7 = 0;
  }
  else {
    lVar5 = (i >> 0x3f & sVar2) + i;
    if ((long)sVar2 <= lVar5) {
      lVar5 = sVar2 - 1;
    }
    lVar7 = (j >> 0x3f & sVar2) + j;
    if ((long)sVar2 <= lVar7) {
      lVar7 = sVar2 - 1;
    }
    lVar8 = lVar7;
    if (lVar7 < lVar5) {
      lVar8 = lVar5;
    }
    if (lVar5 < lVar7) {
      lVar7 = lVar5;
    }
  }
  lVar3 = lVar7 - lVar8;
  lVar5 = -lVar3;
  if (0 < lVar3) {
    lVar5 = lVar3;
  }
  pcVar4 = (char *)zt_malloc_p((lVar5 + 1) * n + 1);
  pcVar6 = pcVar4;
  if (0 < n) {
    do {
      if (lVar7 <= lVar8) {
        lVar5 = 0;
        do {
          pcVar6[lVar5] = s[lVar5 + lVar7];
          lVar5 = lVar5 + 1;
        } while ((lVar8 - lVar7) + 1 != lVar5);
        pcVar6 = pcVar6 + lVar5;
      }
      bVar1 = 1 < n;
      n = n + -1;
    } while (bVar1);
  }
  *pcVar6 = '\0';
  return pcVar4;
}

Assistant:

char *
zt_cstr_dup(const char *s, ssize_t i, ssize_t j, ssize_t n) {
    ssize_t   k;
    char    * new;
    char    * p;

    zt_assert(n >= 0);

    if (!s) {
        return NULL;
    }

    CONVERT(s, i, j);

    p = new = zt_malloc(char, (n * IDXLEN(i, j)) + 1);

    if (IDXLEN(i, j) > 0) {
        while (n-- > 0) {
            for (k = i; k <= j; k++) {
                *p++ = s[k];
            }
        }
    }

    *p = '\0';

    return new;
}